

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  puts("Starting unit tests:\r");
  iVar1 = pal_temperature_get_success();
  iVar2 = pal_temperature_get_with_null_pointer_fail();
  iVar3 = pal_fan_set_speed_hi_success();
  iVar4 = pal_fan_set_speed_low_success();
  uVar5 = iVar4 + iVar3 + iVar2 + iVar1;
  printf("End unit tests with %u errors\r\n",(ulong)uVar5);
  return uVar5;
}

Assistant:

int main(void)
{
    unsigned int count_error = 0;

    printf("Starting unit tests:\r\n");

    if (pal_temperature_get_success() != 0) count_error++;
    if (pal_temperature_get_with_null_pointer_fail() != 0) count_error++;
    if (pal_fan_set_speed_hi_success() != 0) count_error++;
    if (pal_fan_set_speed_low_success() != 0) count_error++;

    printf("End unit tests with %u errors\r\n", count_error);

    return count_error;
}